

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    if (this->CustomRectIds[0] != -1) {
      ImVector<ImFontAtlasCustomRect>::operator[](&this->CustomRects,this->CustomRectIds[0]);
      __assert_fail("r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                    ,0x715,
                    "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                   );
    }
    __assert_fail("CustomRectIds[0] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_draw.cpp"
                  ,0x713,
                  "bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor, ImVec2 *, ImVec2 *, ImVec2 *, ImVec2 *)"
                 );
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    IM_ASSERT(r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}